

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsGraph.cxx
# Opt level: O0

void __thiscall
cmCMakePresetsGraph::PrintPackagePresetList
          (cmCMakePresetsGraph *this,PrintPrecedingNewline *newline)

{
  anon_class_1_0_00000001 local_39;
  function<bool_(const_cmCMakePresetsGraph::PackagePreset_&)> local_38;
  PrintPrecedingNewline *local_18;
  PrintPrecedingNewline *newline_local;
  cmCMakePresetsGraph *this_local;
  
  local_18 = newline;
  newline_local = (PrintPrecedingNewline *)this;
  std::function<bool(cmCMakePresetsGraph::PackagePreset_const&)>::
  function<cmCMakePresetsGraph::PrintPackagePresetList(cmCMakePresetsGraph::PrintPrecedingNewline*)const::__0,void>
            ((function<bool(cmCMakePresetsGraph::PackagePreset_const&)> *)&local_38,&local_39);
  PrintPackagePresetList(this,&local_38,local_18);
  std::function<bool_(const_cmCMakePresetsGraph::PackagePreset_&)>::~function(&local_38);
  return;
}

Assistant:

void cmCMakePresetsGraph::PrintPackagePresetList(
  PrintPrecedingNewline* newline) const
{
  this->PrintPackagePresetList([](const PackagePreset&) { return true; },
                               newline);
}